

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O0

int CVodeSetNonlinearSolverSensStg(void *cvode_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  N_Vector p_Var2;
  SUNNonlinearSolver in_RSI;
  CVodeMem in_RDI;
  int is;
  int retval;
  CVodeMem cv_mem;
  int local_28;
  int local_24;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x31,"CVodeSetNonlinearSolverSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    cvProcessError((CVodeMem)0x0,-0x16,0x39,"CVodeSetNonlinearSolverSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0)
           ) || (in_RSI->ops->setsysfn ==
                 (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    cvProcessError(in_RDI,-0x16,0x42,"CVodeSetNonlinearSolverSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"NLS does not support required operations");
    local_4 = -0x16;
  }
  else if (in_RDI->cv_sensi == 0) {
    cvProcessError(in_RDI,-0x16,0x4a,"CVodeSetNonlinearSolverSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"Forward sensitivity analysis not activated.");
    local_4 = -0x16;
  }
  else if (in_RDI->cv_ism == 2) {
    if ((in_RDI->NLSstg != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLSstg != 0)) {
      SUNNonlinSolFree(in_RDI->NLSstg);
    }
    in_RDI->NLSstg = in_RSI;
    in_RDI->ownNLSstg = 0;
    iVar1 = SUNNonlinSolGetType(in_RSI);
    if (iVar1 == 0) {
      local_24 = SUNNonlinSolSetSysFn(in_RDI->NLSstg,cvNlsResidualSensStg);
    }
    else {
      iVar1 = SUNNonlinSolGetType(in_RSI);
      if (iVar1 != 1) {
        cvProcessError(in_RDI,-0x16,0x6f,"CVodeSetNonlinearSolverSensStg",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                       ,"Invalid nonlinear solver type");
        return -0x16;
      }
      local_24 = SUNNonlinSolSetSysFn(in_RDI->NLSstg,cvNlsFPFunctionSensStg);
    }
    if (local_24 == 0) {
      iVar1 = SUNNonlinSolSetConvTestFn(in_RDI->NLSstg,cvNlsConvTestSensStg,in_RDI);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetMaxIters(in_RDI->NLSstg,3);
        if (iVar1 == 0) {
          if (in_RDI->stgMallocDone == 0) {
            p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->cv_Ns,in_RDI->cv_sunctx);
            in_RDI->zn0Stg = p_Var2;
            if (in_RDI->zn0Stg == (N_Vector)0x0) {
              cvProcessError(in_RDI,-0x14,0x94,"CVodeSetNonlinearSolverSensStg",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                             ,"A memory request failed.");
              return -0x14;
            }
            p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->cv_Ns,in_RDI->cv_sunctx);
            in_RDI->ycorStg = p_Var2;
            if (in_RDI->ycorStg == (N_Vector)0x0) {
              N_VDestroy(in_RDI->zn0Stg);
              cvProcessError(in_RDI,-0x14,0x9d,"CVodeSetNonlinearSolverSensStg",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                             ,"A memory request failed.");
              return -0x14;
            }
            p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->cv_Ns,in_RDI->cv_sunctx);
            in_RDI->ewtStg = p_Var2;
            if (in_RDI->ewtStg == (N_Vector)0x0) {
              N_VDestroy(in_RDI->zn0Stg);
              N_VDestroy(in_RDI->ycorStg);
              cvProcessError(in_RDI,-0x14,0xa7,"CVodeSetNonlinearSolverSensStg",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                             ,"A memory request failed.");
              return -0x14;
            }
            in_RDI->stgMallocDone = 1;
          }
          for (local_28 = 0; local_28 < in_RDI->cv_Ns; local_28 = local_28 + 1) {
            *(N_Vector *)(*in_RDI->zn0Stg->content + (long)local_28 * 8) =
                 in_RDI->cv_znS[0][local_28];
            *(N_Vector *)(*in_RDI->ycorStg->content + (long)local_28 * 8) =
                 in_RDI->cv_acorS[local_28];
            *(N_Vector *)(*in_RDI->ewtStg->content + (long)local_28 * 8) = in_RDI->cv_ewtS[local_28]
            ;
          }
          in_RDI->cv_acnrmScur = 0;
          local_4 = 0;
        }
        else {
          cvProcessError(in_RDI,-0x16,0x89,"CVodeSetNonlinearSolverSensStg",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                         ,"Setting maximum number of nonlinear iterations failed");
          local_4 = -0x16;
        }
      }
      else {
        cvProcessError(in_RDI,-0x16,0x80,"CVodeSetNonlinearSolverSensStg",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                       ,"Setting convergence test function failed");
        local_4 = -0x16;
      }
    }
    else {
      cvProcessError(in_RDI,-0x16,0x76,"CVodeSetNonlinearSolverSensStg",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                     ,"Setting nonlinear system function failed");
      local_4 = -0x16;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x52,"CVodeSetNonlinearSolverSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"Sensitivity solution method is not CV_STAGGERED");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetNonlinearSolverSensStg(void* cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval, is;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    cvProcessError(NULL, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS does not support required operations");
    return (CV_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(cv_mem->cv_sensi))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_ILL_INPUT);
  }

  /* check that staggered corrector was selected */
  if (cv_mem->cv_ism != CV_STAGGERED)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Sensitivity solution method is not CV_STAGGERED");
    return (CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLSstg != NULL) && (cv_mem->ownNLSstg))
  {
    retval = SUNNonlinSolFree(cv_mem->NLSstg);
  }

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLSstg = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLSstg = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSstg, cvNlsResidualSensStg);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSstg, cvNlsFPFunctionSensStg);
  }
  else
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid nonlinear solver type");
    return (CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting nonlinear system function failed");
    return (CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLSstg, cvNlsConvTestSensStg,
                                     cvode_mem);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting convergence test function failed");
    return (CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLSstg, NLS_MAXCOR);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting maximum number of nonlinear iterations failed");
    return (CV_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (cv_mem->stgMallocDone == SUNFALSE)
  {
    cv_mem->zn0Stg = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns, cv_mem->cv_sunctx);
    if (cv_mem->zn0Stg == NULL)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ycorStg = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns, cv_mem->cv_sunctx);
    if (cv_mem->ycorStg == NULL)
    {
      N_VDestroy(cv_mem->zn0Stg);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ewtStg = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns, cv_mem->cv_sunctx);
    if (cv_mem->ewtStg == NULL)
    {
      N_VDestroy(cv_mem->zn0Stg);
      N_VDestroy(cv_mem->ycorStg);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->stgMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    NV_VEC_SW(cv_mem->zn0Stg, is)  = cv_mem->cv_znS[0][is];
    NV_VEC_SW(cv_mem->ycorStg, is) = cv_mem->cv_acorS[is];
    NV_VEC_SW(cv_mem->ewtStg, is)  = cv_mem->cv_ewtS[is];
  }

  /* Reset the acnrmScur flag to SUNFALSE */
  cv_mem->cv_acnrmScur = SUNFALSE;

  return (CV_SUCCESS);
}